

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O3

void pzshape::TPZShapeTetra::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  long lVar2;
  int j;
  ulong uVar3;
  uint uVar4;
  ulong uVar6;
  int iVar7;
  int i;
  ulong uVar8;
  int64_t size;
  TPZFNMatrix<100,_double> phi0;
  TPZFMatrix<double> local_1680;
  double local_15f0 [101];
  TPZFMatrix<double> local_12c8;
  double local_1238 [101];
  TPZFMatrix<double> local_f10;
  double local_e80 [101];
  TPZFMatrix<double> local_b58;
  double local_ac8 [101];
  TPZFMatrix<double> local_7a0;
  double local_710 [101];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  ulong uVar5;
  
  if (3 < order) {
    uVar4 = order - 3;
    uVar5 = (ulong)uVar4;
    local_f10.fElem = local_e80;
    local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_f10.fSize = 100;
    local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar5;
    local_f10.fGiven = local_f10.fElem;
    TPZVec<int>::TPZVec(&local_f10.fPivot.super_TPZVec<int>,0);
    local_f10.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_f10.fPivot.super_TPZVec<int>.fStore = local_f10.fPivot.fExtAlloc;
    local_f10.fPivot.super_TPZVec<int>.fNElements = 0;
    local_f10.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_f10.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_f10.fWork.fStore = (double *)0x0;
    local_f10.fWork.fNElements = 0;
    local_f10.fWork.fNAlloc = 0;
    if (100 < uVar4) {
      local_f10.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_12c8.fElem = local_1238;
    local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_12c8.fSize = 100;
    local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar5;
    local_12c8.fGiven = local_12c8.fElem;
    TPZVec<int>::TPZVec(&local_12c8.fPivot.super_TPZVec<int>,0);
    local_12c8.fPivot.super_TPZVec<int>.fStore = local_12c8.fPivot.fExtAlloc;
    local_12c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_12c8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_12c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_12c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_12c8.fWork.fStore = (double *)0x0;
    local_12c8.fWork.fNElements = 0;
    local_12c8.fWork.fNAlloc = 0;
    if (100 < uVar4) {
      local_12c8.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_1680.fElem = local_15f0;
    local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_1680.fSize = 100;
    local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar5;
    local_1680.fGiven = local_1680.fElem;
    TPZVec<int>::TPZVec(&local_1680.fPivot.super_TPZVec<int>,0);
    local_1680.fPivot.super_TPZVec<int>.fStore = local_1680.fPivot.fExtAlloc;
    local_1680.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_1680.fPivot.super_TPZVec<int>.fNElements = 0;
    local_1680.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_1680.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_1680.fWork.fStore = (double *)0x0;
    local_1680.fWork.fNElements = 0;
    local_1680.fWork.fNAlloc = 0;
    if (100 < uVar4) {
      local_1680.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_3e8.fElem = local_358;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_3e8.fSize = 100;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar5;
    local_3e8.fGiven = local_3e8.fElem;
    TPZVec<int>::TPZVec(&local_3e8.fPivot.super_TPZVec<int>,0);
    local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
    local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_3e8.fWork.fStore = (double *)0x0;
    local_3e8.fWork.fNElements = 0;
    local_3e8.fWork.fNAlloc = 0;
    if (100 < uVar4) {
      local_3e8.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_7a0.fElem = local_710;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_7a0.fSize = 100;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar5;
    local_7a0.fGiven = local_7a0.fElem;
    TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
    local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
    local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_7a0.fWork.fStore = (double *)0x0;
    local_7a0.fWork.fNElements = 0;
    local_7a0.fWork.fNAlloc = 0;
    if (100 < uVar4) {
      local_7a0.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_b58.fElem = local_ac8;
    local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_b58.fSize = 100;
    local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar5;
    local_b58.fGiven = local_b58.fElem;
    TPZVec<int>::TPZVec(&local_b58.fPivot.super_TPZVec<int>,0);
    local_b58.fPivot.super_TPZVec<int>.fStore = local_b58.fPivot.fExtAlloc;
    local_b58.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_b58.fPivot.super_TPZVec<int>.fNElements = 0;
    local_b58.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_b58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_b58.fWork.fStore = (double *)0x0;
    local_b58.fWork.fNElements = 0;
    local_b58.fWork.fNAlloc = 0;
    if (100 < uVar4) {
      local_b58.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    (*(code *)TPZShapeLinear::fOrthogonal)
              (*x->fStore + *x->fStore + -1.0,uVar5,&local_f10,&local_3e8);
    (*(code *)TPZShapeLinear::fOrthogonal)
              (x->fStore[1] + x->fStore[1] + -1.0,uVar5,&local_12c8,&local_7a0);
    (*(code *)TPZShapeLinear::fOrthogonal)
              (x->fStore[2] + x->fStore[2] + -1.0,uVar5,&local_1680,&local_b58);
    uVar8 = 0;
    iVar7 = 0;
    do {
      uVar3 = 0;
      do {
        uVar6 = 0;
        do {
          if ((long)uVar6 < (long)((uVar5 - uVar3) - uVar8)) {
            if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar3) ||
               (local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
               (local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar2 = (long)iVar7;
            if ((iVar7 < 0) ||
               (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2 ||
                ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[lVar2] =
                 local_f10.fElem[uVar8] * local_12c8.fElem[uVar3] * local_1680.fElem[uVar6];
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar3) ||
               (local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
               (local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar1 < 1) || (iVar7 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar1 * lVar2] =
                 (local_3e8.fElem
                  [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar8] +
                 local_3e8.fElem[local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar8]
                 ) * local_12c8.fElem[uVar3] * local_1680.fElem[uVar6];
            if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar3)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
               (local_1680.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar1 < 2) ||
               ((iVar7 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2))))
            {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar1 * lVar2 + 1] =
                 (local_f10.fElem[uVar8] + local_f10.fElem[uVar8]) *
                 local_7a0.fElem[local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar3]
                 * local_1680.fElem[uVar6];
            if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar3) ||
               (local_12c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar6)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar1 < 3) || (iVar7 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar1 * lVar2 + 2] =
                 (local_f10.fElem[uVar8] + local_f10.fElem[uVar8]) * local_12c8.fElem[uVar3] *
                 local_b58.fElem[local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar6]
            ;
            iVar7 = iVar7 + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar5);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
    TPZFMatrix<double>::~TPZFMatrix(&local_b58,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_1680,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_12c8,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_f10,&PTR_PTR_018379a8);
  }
  return;
}

Assistant:

void TPZShapeTetra::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		if(order < 4) return;
		int ord = order-3;
		
		TPZFNMatrix<100, REAL> phi0(ord,1),phi1(ord,1),phi2(ord,1),dphi0(1,ord),dphi1(1,ord),dphi2(1,ord);
        TPZShapeLinear::fOrthogonal(2.*x[0]-1.,ord,phi0,dphi0);
        TPZShapeLinear::fOrthogonal(2.*x[1]-1.,ord,phi1,dphi1);
        TPZShapeLinear::fOrthogonal(2.*x[2]-1.,ord,phi2,dphi2);
        
        
		int index = 0;
		for (int i=0;i<ord;i++) {
			for (int j=0;j<ord;j++) {
				for (int k=0;k<ord;k++) {
					if( i+j+k < ord ) {
						//int index = ord*(ord*i+j)+k;
						phi(index,0) =  phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) =  2.*dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =  2.* phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) =  2.* phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}